

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestMultiProcessHandler.cxx
# Opt level: O2

void __thiscall
cmCTestMultiProcessHandler::~cmCTestMultiProcessHandler(cmCTestMultiProcessHandler *this)

{
  this->_vptr_cmCTestMultiProcessHandler = (_func_int **)&PTR__cmCTestMultiProcessHandler_00685638;
  std::
  _Rb_tree<cmCTestRunTest_*,_cmCTestRunTest_*,_std::_Identity<cmCTestRunTest_*>,_std::less<cmCTestRunTest_*>,_std::allocator<cmCTestRunTest_*>_>
  ::~_Rb_tree(&(this->RunningTests)._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&(this->LockedResources)._M_t);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->LastTestsFailed);
  std::
  _Rb_tree<int,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&(this->TestOutput)._M_t);
  std::
  _Rb_tree<int,_std::pair<const_int,_bool>,_std::_Select1st<std::pair<const_int,_bool>_>,_std::less<int>,_std::allocator<std::pair<const_int,_bool>_>_>
  ::~_Rb_tree(&(this->TestFinishMap)._M_t);
  std::
  _Rb_tree<int,_std::pair<const_int,_bool>,_std::_Select1st<std::pair<const_int,_bool>_>,_std::less<int>,_std::allocator<std::pair<const_int,_bool>_>_>
  ::~_Rb_tree(&(this->TestRunningMap)._M_t);
  std::
  _Rb_tree<int,_std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>,_std::_Select1st<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
  ::~_Rb_tree((_Rb_tree<int,_std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>,_std::_Select1st<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
               *)&this->Properties);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&this->SortedTests);
  std::
  _Rb_tree<int,_std::pair<const_int,_cmCTestMultiProcessHandler::TestSet>,_std::_Select1st<std::pair<const_int,_cmCTestMultiProcessHandler::TestSet>_>,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestMultiProcessHandler::TestSet>_>_>
  ::~_Rb_tree((_Rb_tree<int,_std::pair<const_int,_cmCTestMultiProcessHandler::TestSet>,_std::_Select1st<std::pair<const_int,_cmCTestMultiProcessHandler::TestSet>_>,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestMultiProcessHandler::TestSet>_>_>
               *)&this->Tests);
  return;
}

Assistant:

cmCTestMultiProcessHandler::~cmCTestMultiProcessHandler()
{
}